

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::SameValueSubstitution::SameValueSubstitution
          (SameValueSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,UnicodeString *description,
          UErrorCode *status)

{
  UErrorCode *this_00;
  int8_t iVar1;
  ConstChar16Ptr local_38;
  UErrorCode *local_30;
  UErrorCode *status_local;
  UnicodeString *description_local;
  NFRuleSet *_ruleSet_local;
  SameValueSubstitution *pSStack_10;
  int32_t _pos_local;
  SameValueSubstitution *this_local;
  
  local_30 = status;
  status_local = (UErrorCode *)description;
  description_local = (UnicodeString *)_ruleSet;
  _ruleSet_local._4_4_ = _pos;
  pSStack_10 = this;
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,description,status);
  this_00 = status_local;
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SameValueSubstitution_0049f0d8;
  ConstChar16Ptr::ConstChar16Ptr(&local_38,L"==");
  iVar1 = UnicodeString::compare((UnicodeString *)this_00,&local_38,2);
  ConstChar16Ptr::~ConstChar16Ptr(&local_38);
  if (iVar1 == '\0') {
    *local_30 = U_PARSE_ERROR;
  }
  return;
}

Assistant:

SameValueSubstitution::SameValueSubstitution(int32_t _pos,
                        const NFRuleSet* _ruleSet,
                        const UnicodeString& description,
                        UErrorCode& status)
: NFSubstitution(_pos, _ruleSet, description, status)
{
    if (0 == description.compare(gEqualsEquals, 2)) {
        // throw new IllegalArgumentException("== is not a legal token");
        status = U_PARSE_ERROR;
    }
}